

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

SVGRadialGradientAttributes * __thiscall
lunasvg::SVGRadialGradientElement::collectGradientAttributes
          (SVGRadialGradientAttributes *__return_storage_ptr__,SVGRadialGradientElement *this)

{
  SVGGradientElement *pSVar1;
  ElementID EVar2;
  bool bVar3;
  Document *document;
  SVGRadialGradientElement *pSVar4;
  size_type sVar5;
  SVGElement *targetElement;
  SVGRadialGradientElement *element;
  SVGRadialGradientElement *local_48;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  SVGRadialGradientElement *this_local;
  
  processedGradients._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  SVGRadialGradientAttributes::SVGRadialGradientAttributes(__return_storage_ptr__);
  std::
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::set((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
         *)&current);
  local_48 = this;
  do {
    SVGGradientElement::collectGradientAttributes
              (&local_48->super_SVGGradientElement,
               &__return_storage_ptr__->super_SVGGradientAttributes);
    EVar2 = SVGElement::id((SVGElement *)local_48);
    pSVar4 = local_48;
    if (EVar2 == RadialGradient) {
      bVar3 = SVGRadialGradientAttributes::hasCx(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Cx), bVar3)) {
        SVGRadialGradientAttributes::setCx(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGRadialGradientAttributes::hasCy(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Cy), bVar3)) {
        SVGRadialGradientAttributes::setCy(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGRadialGradientAttributes::hasR(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,R), bVar3)) {
        SVGRadialGradientAttributes::setR(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGRadialGradientAttributes::hasFx(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Fx), bVar3)) {
        SVGRadialGradientAttributes::setFx(__return_storage_ptr__,pSVar4);
      }
      bVar3 = SVGRadialGradientAttributes::hasFy(__return_storage_ptr__);
      if ((!bVar3) && (bVar3 = SVGElement::hasAttribute((SVGElement *)pSVar4,Fy), bVar3)) {
        SVGRadialGradientAttributes::setFy(__return_storage_ptr__,pSVar4);
      }
    }
    pSVar1 = &local_48->super_SVGGradientElement;
    document = SVGNode::document((SVGNode *)this);
    pSVar4 = (SVGRadialGradientElement *)
             SVGURIReference::getTargetElement(&pSVar1->super_SVGURIReference,document);
    if ((pSVar4 == (SVGRadialGradientElement *)0x0) ||
       ((EVar2 = SVGElement::id((SVGElement *)pSVar4), EVar2 != LinearGradient &&
        (EVar2 = SVGElement::id((SVGElement *)pSVar4), EVar2 != RadialGradient)))) break;
    std::
    set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
    ::insert((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
              *)&current,(value_type *)&local_48);
    local_48 = pSVar4;
    sVar5 = std::
            set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
            ::count((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
                     *)&current,(key_type *)&local_48);
  } while (sVar5 == 0);
  SVGRadialGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~set((set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
          *)&current);
  return __return_storage_ptr__;
}

Assistant:

SVGRadialGradientAttributes SVGRadialGradientElement::collectGradientAttributes() const
{
    SVGRadialGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::RadialGradient) {
            auto element = static_cast<const SVGRadialGradientElement*>(current);
            if(!attributes.hasCx() && element->hasAttribute(PropertyID::Cx))
                attributes.setCx(element);
            if(!attributes.hasCy() && element->hasAttribute(PropertyID::Cy))
                attributes.setCy(element);
            if(!attributes.hasR() && element->hasAttribute(PropertyID::R))
                attributes.setR(element);
            if(!attributes.hasFx() && element->hasAttribute(PropertyID::Fx))
                attributes.setFx(element);
            if(!attributes.hasFy() && element->hasAttribute(PropertyID::Fy)) {
                attributes.setFy(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}